

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O3

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *st,string *msg)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ostream *poVar4;
  Filtration_value *pFVar5;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *pSVar6;
  int vertex;
  int iVar7;
  pointer pvVar8;
  anon_class_1_0_00000001 local_71;
  undefined1 local_70 [32];
  pointer local_50;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *local_48;
  pointer local_40;
  Simplex_handle local_38;
  
  local_70._0_8_ = st;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>)_2_>
            (st,(is_before_in_totally_ordered_filtration *)local_70,&local_71);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"* ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"* The complex contains ",0x17);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices(st,&st->root_);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," simplices",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - dimension ",0xf);
  if (st->dimension_to_be_lowered_ == true) {
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::lower_upper_bound_dimension
              (st);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::clog,st->dimension_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "* Iterator on Simplices in the filtration, with [filtration value]:\n",0x44);
  pvVar8 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (st->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 == local_50) {
    local_70._0_8_ = st;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>)_2_>
              (st,(is_before_in_totally_ordered_filtration *)local_70,&local_71);
    pvVar8 = (st->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (st->filtration_vect_).
               super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_48 = st;
  if (pvVar8 != local_50) {
    do {
      pSVar6 = local_48;
      ppVar1 = pvVar8->m_ptr;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"[",1);
      pFVar5 = (Filtration_value *)&ppVar1->second;
      if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                     *)0x0) {
        pFVar5 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                  Filtration_simplex_base_real::inf_;
      }
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 vsnprintf,0x148,"%f",
                 (double)(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                            *)pFVar5)->super_Filtration_simplex_base).filt_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(char *)local_70._0_8_,
                          CONCAT44(local_70._12_4_,local_70._8_4_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
      local_40 = pvVar8;
      if ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_70._0_8_ !=
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
      }
      local_38.m_ptr = ppVar1;
      Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
                ((Simplex_vertex_range *)local_70,pSVar6,&local_38);
      uVar3 = local_70._24_4_;
      uVar2 = local_70._16_8_;
      pSVar6 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_70._0_8_;
      iVar7 = local_70._8_4_;
      if (local_70._8_4_ != local_70._24_4_ || local_70._0_8_ != local_70._16_8_) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"(",1);
          poVar4 = (ostream *)std::ostream::operator<<(&std::clog,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          iVar7 = (int)(pSVar6->nodes_label_to_list_)._M_h._M_bucket_count;
          pSVar6 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
                   (pSVar6->nodes_label_to_list_)._M_h._M_buckets;
        } while (iVar7 != uVar3 ||
                 pSVar6 != (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)uVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      pvVar8 = local_40 + 1;
    } while (pvVar8 != local_50);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}